

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall Js::InterpreterStackFrame::RestoreSp(InterpreterStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  InterpreterStackFrame *this_local;
  
  if (*(long *)(this + 0x38) == 0) {
    ResetOut(this);
  }
  else {
    if (*(ulong *)(this + 0x30) <= *(ulong *)(this + 0x38)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x991,"(m_outSpCached < m_outSp)","m_outSpCached < m_outSp");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    *(undefined8 *)(this + 0x30) = *(undefined8 *)(this + 0x38);
    *(undefined8 *)(this + 0x38) = **(undefined8 **)(this + 0x30);
    if ((*(long *)(this + 0x38) != 0) && (*(ulong *)(this + 0x30) < *(ulong *)(this + 0x38))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x995,"(m_outSpCached == nullptr || m_outSpCached <= m_outSp)",
                                  "m_outSpCached == nullptr || m_outSpCached <= m_outSp");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    *(undefined8 *)(this + 0x28) = *(undefined8 *)(*(long *)(this + 0x30) + 8);
  }
  return;
}

Assistant:

inline void InterpreterStackFrame::RestoreSp()
    {
        // This will be called in the Finally block to restore from the previous SP cached.

        // m_outSpCached can be null if the catch block is called.
        if (m_outSpCached != nullptr)
        {
            Assert(m_outSpCached < m_outSp);
            m_outSp = m_outSpCached;

            m_outSpCached = (Var*)*m_outSp;
            Assert(m_outSpCached == nullptr || m_outSpCached <= m_outSp);

            m_outParams = (Var*)*(m_outSp + 1);
        }
        else
        {
            ResetOut();
        }
    }